

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O0

PropertyT<OpenMesh::Attributes::StatusInfo> * __thiscall
OpenMesh::PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
          (PropertyContainer *this,BasePropHandleT<OpenMesh::Attributes::StatusInfo> _h)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference ppBVar4;
  PropertyT<OpenMesh::Attributes::StatusInfo> *local_58;
  PropertyT<OpenMesh::Attributes::StatusInfo> *p;
  PropertyContainer *this_local;
  BasePropHandleT<OpenMesh::Attributes::StatusInfo> _h_local;
  
  this_local._4_4_ = _h.super_BaseHandle.idx_;
  iVar2 = BaseHandle::idx((BaseHandle *)((long)&this_local + 4));
  bVar1 = false;
  if (-1 < iVar2) {
    iVar2 = BaseHandle::idx((BaseHandle *)((long)&this_local + 4));
    sVar3 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::size
                      (&this->properties_);
    bVar1 = iVar2 < (int)sVar3;
  }
  if (!bVar1) {
    __assert_fail("_h.idx() >= 0 && _h.idx() < (int)properties_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Utils/PropertyContainer.hh"
                  ,0x9f,
                  "const PropertyT<T> &OpenMesh::PropertyContainer::property(BasePropHandleT<T>) const [T = OpenMesh::Attributes::StatusInfo]"
                 );
  }
  iVar2 = BaseHandle::idx((BaseHandle *)((long)&this_local + 4));
  ppBVar4 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::
            operator[](&this->properties_,(long)iVar2);
  if (*ppBVar4 == (value_type)0x0) {
    __assert_fail("properties_[_h.idx()] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Utils/PropertyContainer.hh"
                  ,0xa0,
                  "const PropertyT<T> &OpenMesh::PropertyContainer::property(BasePropHandleT<T>) const [T = OpenMesh::Attributes::StatusInfo]"
                 );
  }
  iVar2 = BaseHandle::idx((BaseHandle *)((long)&this_local + 4));
  ppBVar4 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::
            operator[](&this->properties_,(long)iVar2);
  if (*ppBVar4 == (value_type)0x0) {
    local_58 = (PropertyT<OpenMesh::Attributes::StatusInfo> *)0x0;
  }
  else {
    local_58 = (PropertyT<OpenMesh::Attributes::StatusInfo> *)
               __dynamic_cast(*ppBVar4,&BaseProperty::typeinfo,
                              &PropertyT<OpenMesh::Attributes::StatusInfo>::typeinfo,0);
  }
  if (local_58 != (PropertyT<OpenMesh::Attributes::StatusInfo> *)0x0) {
    return local_58;
  }
  __assert_fail("p != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Utils/PropertyContainer.hh"
                ,0xa5,
                "const PropertyT<T> &OpenMesh::PropertyContainer::property(BasePropHandleT<T>) const [T = OpenMesh::Attributes::StatusInfo]"
               );
}

Assistant:

const PropertyT<T>& property(BasePropHandleT<T> _h) const
  {
    assert(_h.idx() >= 0 && _h.idx() < (int)properties_.size());
    assert(properties_[_h.idx()] != NULL);
#ifdef OM_FORCE_STATIC_CAST
    return *static_cast<PropertyT<T>*>(properties_[_h.idx()]);
#else
    PropertyT<T>* p = dynamic_cast<PropertyT<T>*>(properties_[_h.idx()]);
    assert(p != NULL);
    return *p;
#endif
  }